

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::File::WriteStringToFileOrDie(File *this,string_view contents,string *name)

{
  int iVar1;
  FILE *__s;
  Nullable<const_char_*> failure_msg;
  LogMessage *pLVar2;
  int *piVar3;
  string *v;
  LogMessage local_38;
  File *local_28;
  
  v = (string *)contents._M_str;
  __s = fopen((v->_M_dataplus)._M_p,"wb");
  if (__s == (FILE *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
               ,0x67,"file != nullptr");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (&local_38,(char (*) [7])"fopen(");
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar2,(char (*) [10])", \"wb\"): ");
    piVar3 = __errno_location();
    local_28 = (File *)strerror(*piVar3);
    absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(pLVar2,(char **)&local_28);
  }
  else {
    local_38._0_8_ = fwrite((void *)contents._M_len,1,(size_t)this,__s);
    local_28 = this;
    failure_msg = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                            ((unsigned_long *)&local_38,(unsigned_long *)&local_28,
                             "fwrite(contents.data(), 1, contents.size(), file) == contents.size()")
    ;
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      iVar1 = fclose(__s);
      if (iVar1 == 0) {
        return;
      }
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
                 ,0x6c,"fclose(file) == 0");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (&local_38,(char (*) [8])"fclose(");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [4])0xf3c2b5);
      piVar3 = __errno_location();
      local_28 = (File *)strerror(*piVar3);
      absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(pLVar2,(char **)&local_28)
      ;
    }
    else {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_38,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
                 ,0x6a,failure_msg);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (&local_38,(char (*) [8])"fwrite(");
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar2,v);
      pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar2,(char (*) [4])0xf3c2b5);
      piVar3 = __errno_location();
      local_28 = (File *)strerror(*piVar3);
      absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(pLVar2,(char **)&local_28)
      ;
    }
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

void File::WriteStringToFileOrDie(absl::string_view contents,
                                  const std::string& name) {
  FILE* file = fopen(name.c_str(), "wb");
  ABSL_CHECK(file != nullptr)
      << "fopen(" << name << ", \"wb\"): " << strerror(errno);
  ABSL_CHECK_EQ(fwrite(contents.data(), 1, contents.size(), file),
                contents.size())
      << "fwrite(" << name << "): " << strerror(errno);
  ABSL_CHECK(fclose(file) == 0)
      << "fclose(" << name << "): " << strerror(errno);
}